

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall doctest::anon_unknown_15::ConsoleReporter::logTestStart(ConsoleReporter *this)

{
  ostream *poVar1;
  TestCaseData *pTVar2;
  int iVar3;
  size_t sVar4;
  pointer pSVar5;
  char *pcVar6;
  ulong uVar7;
  TestCaseData *pTVar8;
  long lVar9;
  ulong uVar10;
  
  if (this->hasLoggedCurrentTestStart == false) {
    poVar1 = this->s;
    Color::operator<<(poVar1,Yellow);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,
               "===============================================================================\n",
               0x50);
    pTVar2 = this->tc;
    pTVar8 = pTVar2;
    if ((pTVar2->m_file).field_0.buf[0x17] < '\0') {
      pTVar8 = (TestCaseData *)(pTVar2->m_file).field_0.data.ptr;
    }
    (*(this->super_IReporter)._vptr_IReporter[0xe])(this,pTVar8,(ulong)pTVar2->m_line,"\n");
    if (this->tc->m_description != (char *)0x0) {
      poVar1 = this->s;
      Color::operator<<(poVar1,Yellow);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"DESCRIPTION: ",0xd);
      Color::operator<<(poVar1,None);
      pcVar6 = this->tc->m_description;
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar1 + (int)poVar1->_vptr_basic_ostream[-3]);
      }
      else {
        sVar4 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar6,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    }
    pcVar6 = this->tc->m_test_suite;
    if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) {
      poVar1 = this->s;
      Color::operator<<(poVar1,Yellow);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"TEST SUITE: ",0xc);
      Color::operator<<(poVar1,None);
      pcVar6 = this->tc->m_test_suite;
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar1 + (int)poVar1->_vptr_basic_ostream[-3]);
      }
      else {
        sVar4 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar6,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    }
    iVar3 = strncmp(this->tc->m_name,"  Scenario:",0xb);
    if (iVar3 != 0) {
      poVar1 = this->s;
      Color::operator<<(poVar1,Yellow);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"TEST CASE:  ",0xc);
    }
    poVar1 = this->s;
    Color::operator<<(poVar1,None);
    pcVar6 = this->tc->m_name;
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar1 + (int)poVar1->_vptr_basic_ostream[-3]);
    }
    else {
      sVar4 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar6,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    uVar10 = this->currentSubcaseLevel;
    if (uVar10 != 0) {
      lVar9 = 0;
      uVar7 = 0;
      do {
        pSVar5 = (this->subcasesStack).
                 super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((pSVar5->m_name).field_0.buf[lVar9 + 0x17] < '\0') {
          pcVar6 = *(char **)((long)&(pSVar5->m_name).field_0 + lVar9);
        }
        else {
          pcVar6 = (pSVar5->m_name).field_0.buf + lVar9;
        }
        if (*pcVar6 != '\0') {
          poVar1 = this->s;
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
          doctest::operator<<(poVar1,(String *)
                                     ((long)&(((this->subcasesStack).
                                               super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->m_name).
                                             field_0 + lVar9));
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
        }
        uVar7 = uVar7 + 1;
        uVar10 = this->currentSubcaseLevel;
        lVar9 = lVar9 + 0x28;
      } while (uVar7 < uVar10);
    }
    if (uVar10 != ((long)(this->subcasesStack).
                         super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->subcasesStack).
                         super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) {
      poVar1 = this->s;
      Color::operator<<(poVar1,Yellow);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"\nDEEPEST SUBCASE STACK REACHED (DIFFERENT FROM THE CURRENT ONE):\n",0x41);
      Color::operator<<(poVar1,None);
      pSVar5 = (this->subcasesStack).
               super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->subcasesStack).
          super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>.
          _M_impl.super__Vector_impl_data._M_finish != pSVar5) {
        lVar9 = 0;
        uVar10 = 0;
        do {
          if ((pSVar5->m_name).field_0.buf[lVar9 + 0x17] < '\0') {
            pcVar6 = *(char **)((long)&(pSVar5->m_name).field_0 + lVar9);
          }
          else {
            pcVar6 = (pSVar5->m_name).field_0.buf + lVar9;
          }
          if (*pcVar6 != '\0') {
            poVar1 = this->s;
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
            doctest::operator<<(poVar1,(String *)
                                       ((long)&(((this->subcasesStack).
                                                 super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->m_name)
                                               .field_0 + lVar9));
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
          }
          uVar10 = uVar10 + 1;
          pSVar5 = (this->subcasesStack).
                   super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar9 = lVar9 + 0x28;
        } while (uVar10 < (ulong)(((long)(this->subcasesStack).
                                         super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar5
                                  >> 3) * -0x3333333333333333));
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(this->s,"\n",1);
    this->hasLoggedCurrentTestStart = true;
  }
  return;
}

Assistant:

void logTestStart() {
            if(hasLoggedCurrentTestStart)
                return;

            separator_to_stream();
            file_line_to_stream(tc->m_file.c_str(), tc->m_line, "\n");
            if(tc->m_description)
                s << Color::Yellow << "DESCRIPTION: " << Color::None << tc->m_description << "\n";
            if(tc->m_test_suite && tc->m_test_suite[0] != '\0')
                s << Color::Yellow << "TEST SUITE: " << Color::None << tc->m_test_suite << "\n";
            if(strncmp(tc->m_name, "  Scenario:", 11) != 0)
                s << Color::Yellow << "TEST CASE:  ";
            s << Color::None << tc->m_name << "\n";

            for(size_t i = 0; i < currentSubcaseLevel; ++i) {
                if(subcasesStack[i].m_name[0] != '\0')
                    s << "  " << subcasesStack[i].m_name << "\n";
            }

            if(currentSubcaseLevel != subcasesStack.size()) {
                s << Color::Yellow << "\nDEEPEST SUBCASE STACK REACHED (DIFFERENT FROM THE CURRENT ONE):\n" << Color::None;
                for(size_t i = 0; i < subcasesStack.size(); ++i) {
                    if(subcasesStack[i].m_name[0] != '\0')
                        s << "  " << subcasesStack[i].m_name << "\n";
                }
            }

            s << "\n";

            hasLoggedCurrentTestStart = true;
        }